

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O0

bool __thiscall ON_PlugInRef::Write(ON_PlugInRef *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool local_19;
  bool rc;
  ON_BinaryArchive *file_local;
  ON_PlugInRef *this_local;
  
  local_19 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,2);
  if (local_19) {
    if (local_19) {
      local_19 = ON_BinaryArchive::WriteUuid(file,&this->m_plugin_id);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(file,this->m_plugin_type);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_plugin_name);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_plugin_version);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_plugin_filename);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_organization);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_address);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_country);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_phone);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_email);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_website);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_updateurl);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteString(file,&this->m_developer_fax);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(file,this->m_plugin_platform);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(file,this->m_plugin_sdk_version);
    }
    if (local_19 != false) {
      local_19 = ON_BinaryArchive::WriteInt(file,this->m_plugin_sdk_service_release);
    }
    bVar1 = ON_BinaryArchive::EndWrite3dmChunk(file);
    if (!bVar1) {
      local_19 = false;
    }
  }
  return local_19;
}

Assistant:

bool ON_PlugInRef::Write( ON_BinaryArchive& file ) const
{
  bool rc = file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK,1,2);
  if (rc)
  {
    //version 1.0 fields
    if (rc) rc = file.WriteUuid(m_plugin_id);
    if (rc) rc = file.WriteInt(m_plugin_type);
    if (rc) rc = file.WriteString(m_plugin_name);
    if (rc) rc = file.WriteString(m_plugin_version);
    if (rc) rc = file.WriteString(m_plugin_filename);

    // version 1.1 fields 
    if (rc) rc = file.WriteString(m_developer_organization);
    if (rc) rc = file.WriteString(m_developer_address);
    if (rc) rc = file.WriteString(m_developer_country);
    if (rc) rc = file.WriteString(m_developer_phone);
    if (rc) rc = file.WriteString(m_developer_email);
    if (rc) rc = file.WriteString(m_developer_website);
    if (rc) rc = file.WriteString(m_developer_updateurl);
    if (rc) rc = file.WriteString(m_developer_fax);

    // version 1.2 fields
    if (rc) rc = file.WriteInt(m_plugin_platform);
    if (rc) rc = file.WriteInt(m_plugin_sdk_version);
    if (rc) rc = file.WriteInt(m_plugin_sdk_service_release);

    if( !file.EndWrite3dmChunk() )
      rc = false;
  }
  return rc;
}